

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O2

void __thiscall pg::SSISolver::run(SSISolver *this)

{
  bitset *this_00;
  bitset *this_01;
  bitset *this_02;
  ulong *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  uint *puVar7;
  ulong uVar8;
  int *piVar9;
  ostream *poVar10;
  Game *pGVar11;
  Error *this_03;
  int iVar12;
  ulong uVar13;
  _label_vertex local_50;
  _label_vertex local_40;
  
  this_00 = &this->G;
  bitset::operator=(this_00,(this->super_Solver).disabled);
  bitset::flip(this_00);
  bVar2 = bitset::none(this_00);
  if (bVar2) {
    return;
  }
  sVar6 = bitset::find_last(this_00);
  pGVar11 = (this->super_Solver).game;
  puVar7 = (this->Q).queue;
  this->k = pGVar11->_priority[(int)sVar6] + 1;
  uVar8 = pGVar11->n_vertices;
  (this->Q).pointer = 0;
  if (puVar7 != (uint *)0x0) {
    operator_delete__(puVar7);
    pGVar11 = (this->super_Solver).game;
  }
  puVar7 = (uint *)operator_new__((uVar8 & 0xffffffff) << 2);
  (this->Q).queue = puVar7;
  bitset::resize(&this->C,pGVar11->n_vertices);
  bitset::resize(&this->V,((this->super_Solver).game)->n_vertices);
  this_01 = &this->W0;
  bitset::resize(this_01,((this->super_Solver).game)->n_vertices);
  this_02 = &this->W1;
  bitset::resize(this_02,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->halt0,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->halt1,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->V0,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->V1,((this->super_Solver).game)->n_vertices);
  pGVar11 = (this->super_Solver).game;
  uVar8 = (long)this->k * pGVar11->n_vertices;
  piVar9 = (int *)operator_new__(-(ulong)(uVar8 >> 0x3e != 0) | uVar8 * 4);
  this->val = piVar9;
  piVar9 = (int *)operator_new__(-(ulong)((ulong)pGVar11->n_vertices >> 0x3e != 0) |
                                 pGVar11->n_vertices << 2);
  this->str0 = piVar9;
  piVar9 = (int *)operator_new__(-(ulong)((ulong)pGVar11->n_vertices >> 0x3e != 0) |
                                 pGVar11->n_vertices << 2);
  this->str1 = piVar9;
  piVar9 = (int *)operator_new__(-(ulong)((ulong)pGVar11->n_vertices >> 0x3e != 0) |
                                 pGVar11->n_vertices << 2);
  this->first_in = piVar9;
  piVar9 = (int *)operator_new__(-(ulong)((ulong)pGVar11->n_vertices >> 0x3e != 0) |
                                 pGVar11->n_vertices << 2);
  this->next_in = piVar9;
  for (sVar6 = bitset::find_first(this_00); sVar6 != 0xffffffffffffffff;
      sVar6 = bitset::find_next(this_00,sVar6)) {
    iVar12 = (int)sVar6;
    iVar3 = Solver::owner(&this->super_Solver,iVar12);
    uVar8 = 1L << (sVar6 & 0x3f);
    puVar1 = (&this->V0)[iVar3 != 0]._bits + (sVar6 >> 6);
    *puVar1 = *puVar1 | uVar8;
    pGVar11 = (this->super_Solver).game;
    piVar9 = pGVar11->_outedges + pGVar11->_firstouts[iVar12];
    do {
      iVar3 = *piVar9;
      uVar13 = (ulong)iVar3;
      if (uVar13 == 0xffffffffffffffff) {
        this_03 = (Error *)__cxa_allocate_exception(0x40);
        Error::Error(this_03,"logic error",
                     "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/ssi.cpp"
                     ,0x19a);
        __cxa_throw(this_03,&Error::typeinfo,Error::~Error);
      }
      piVar9 = piVar9 + 1;
    } while (((this->G)._bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0);
    if (1 < (this->super_Solver).trace) {
      poVar10 = std::operator<<((this->super_Solver).logger,"initial strategy: ");
      local_40.g = (this->super_Solver).game;
      local_40.v = iVar12;
      poVar10 = operator<<(poVar10,&local_40);
      poVar10 = std::operator<<(poVar10," => ");
      local_50.g = (this->super_Solver).game;
      local_50.v = iVar3;
      poVar10 = operator<<(poVar10,&local_50);
      std::endl<char,std::char_traits<char>>(poVar10);
      pGVar11 = (this->super_Solver).game;
    }
    this->str0[sVar6] = iVar3;
    this->str1[sVar6] = iVar3;
    puVar1 = (&this->halt0)[(*(byte *)(pGVar11->_priority + iVar12) & 1) == 0]._bits + (sVar6 >> 6);
    *puVar1 = *puVar1 | uVar8;
  }
  sVar6 = bitset::count(this_00);
  iVar3 = 0;
  iVar12 = 0;
  do {
    while( true ) {
      iVar12 = iVar12 + 1;
      if ((this->super_Solver).trace != 0) {
        poVar10 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;208mMajor iteration ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar12);
        poVar10 = std::operator<<(poVar10,"\x1b[m");
        std::endl<char,std::char_traits<char>>(poVar10);
        if ((this->super_Solver).trace != 0) {
          poVar10 = std::operator<<((this->super_Solver).logger,"Computing Odd\'s best response...")
          ;
          std::endl<char,std::char_traits<char>>(poVar10);
        }
      }
      do {
        iVar3 = iVar3 + 1;
        compute_vals_ll(this,0);
        iVar4 = switch_opp_strategy(this,0);
      } while (iVar4 != 0);
      iVar4 = mark_solved(this,0);
      if (iVar4 == 0) break;
LAB_0015b1c7:
      sVar6 = sVar6 - (long)iVar4;
      if (sVar6 == 0) goto LAB_0015b1d2;
    }
    if ((this->super_Solver).trace != 0) {
      poVar10 = std::operator<<((this->super_Solver).logger,"Computing Even\'s best response...");
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    do {
      iVar3 = iVar3 + 1;
      compute_vals_ll(this,1);
      iVar4 = switch_opp_strategy(this,1);
    } while (iVar4 != 0);
    iVar4 = mark_solved(this,1);
    if (iVar4 != 0) goto LAB_0015b1c7;
    if ((this->super_Solver).trace != 0) {
      poVar10 = std::operator<<((this->super_Solver).logger,"Improving Odd\'s strategy...");
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    iVar5 = switch_sym_strategy(this,1);
    iVar4 = (this->super_Solver).trace;
    if (iVar5 == 0) {
      if (iVar4 != 0) {
        poVar10 = std::operator<<((this->super_Solver).logger,
                                  "No (possible) improvements - Even wins remainder.");
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      bitset::operator|=(this_01,this_00);
      for (sVar6 = bitset::find_first(this_00); sVar6 != 0xffffffffffffffff;
          sVar6 = bitset::find_next(this_00,sVar6)) {
        this->str0[sVar6] = this->str1[sVar6];
      }
      goto LAB_0015b1d2;
    }
    if (iVar4 != 0) {
      poVar10 = std::operator<<((this->super_Solver).logger,"Improving Even\'s strategy...");
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    compute_vals_ll(this,0);
    iVar4 = switch_sym_strategy(this,0);
  } while (iVar4 != 0);
  if ((this->super_Solver).trace != 0) {
    poVar10 = std::operator<<((this->super_Solver).logger,
                              "No (possible) improvements - Odd wins remainder.");
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  bitset::operator|=(this_02,this_00);
  for (sVar6 = bitset::find_first(this_00); sVar6 != 0xffffffffffffffff;
      sVar6 = bitset::find_next(this_00,sVar6)) {
    this->str1[sVar6] = this->str0[sVar6];
  }
LAB_0015b1d2:
  for (sVar6 = bitset::find_first(this_01); sVar6 != 0xffffffffffffffff;
      sVar6 = bitset::find_next(this_01,sVar6)) {
    iVar5 = Solver::owner(&this->super_Solver,(int)sVar6);
    iVar4 = -1;
    if (iVar5 == 0) {
      iVar4 = this->str0[sVar6];
    }
    Solver::solve(&this->super_Solver,(int)sVar6,0,iVar4);
  }
  for (sVar6 = bitset::find_first(this_02); sVar6 != 0xffffffffffffffff;
      sVar6 = bitset::find_next(this_02,sVar6)) {
    iVar5 = Solver::owner(&this->super_Solver,(int)sVar6);
    iVar4 = -1;
    if (iVar5 == 1) {
      iVar4 = this->str1[sVar6];
    }
    Solver::solve(&this->super_Solver,(int)sVar6,1,iVar4);
  }
  if (this->val != (int *)0x0) {
    operator_delete__(this->val);
  }
  if (this->first_in != (int *)0x0) {
    operator_delete__(this->first_in);
  }
  if (this->next_in != (int *)0x0) {
    operator_delete__(this->next_in);
  }
  if (this->str0 != (int *)0x0) {
    operator_delete__(this->str0);
  }
  if (this->str1 != (int *)0x0) {
    operator_delete__(this->str1);
  }
  poVar10 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar12);
  poVar10 = std::operator<<(poVar10," major iterations, ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar3);
  poVar10 = std::operator<<(poVar10," minor iterations.");
  std::endl<char,std::char_traits<char>>(poVar10);
  return;
}

Assistant:

void
SSISolver::run()
{
    // set G to the game
    G = disabled;
    G.flip();
    if (G.none()) return; // nothing to do

    // assume the game is ordered
    k = 1 + priority(G.find_last());

    Q.resize(nodecount());
    C.resize(nodecount());
    V.resize(nodecount());
    W0.resize(nodecount());
    W1.resize(nodecount());
    halt0.resize(nodecount());
    halt1.resize(nodecount());
    V0.resize(nodecount());
    V1.resize(nodecount());

    val = new int[k*nodecount()];
    str0 = new int[nodecount()];
    str1 = new int[nodecount()];

    first_in = new int[nodecount()];
    next_in = new int[nodecount()];

    // initialize the datastructure
    for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
        // set V0 or V1
        (owner(v) == 0 ? V0 : V1)[v] = true;
        // select first available edge
        int to = -1;
        for (auto curedge = outs(v); *curedge != -1; curedge++) {
            int u = *curedge;
            if (G[u]) {
                to = u;
                break;
            }
        }
        if (to == -1) LOGIC_ERROR;
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "initial strategy: " << label_vertex(v) << " => " << label_vertex(to) << std::endl;
        }
#endif
        // set initial strategy of <v> to <to>.
        str0[v] = to;
        str1[v] = to;
        // halt for the right player
        if (priority(v)&1) {
            // odd priority, so halt for even
            halt0[v] = true;
        } else {
            // even priority, so halt for odd
            halt1[v] = true;
        }
    }

    int minor = 0, major = 0;
    auto remaining = G.count();

    for (;;) {
        ++major;
        if (trace) {
            logger << "\033[1;38;5;208mMajor iteration " << major << "\033[m" << std::endl;
        }
        {
            // First compute Odd's best response for Even's strategy
            if (trace) logger << "Computing Odd's best response..." << std::endl;
            for (;;) {
                ++minor;
                compute_vals_ll(0);
                int count = switch_opp_strategy(0);
                if (count == 0) break; // if nothing left, done
            }
            int solved = mark_solved(0); // mark nodes won by Even after Odd's best response
            if (solved != 0) {
                remaining -= solved;
                if (remaining <= 0) break;
                continue; // restart major loop
            }
        }
        {
            // Now compute Even's best response for Odd's strategy
            if (trace) logger << "Computing Even's best response..." << std::endl;
            for (;;) {
                ++minor;
                compute_vals_ll(1);
                int count = switch_opp_strategy(1);
                if (count == 0) break; // if nothing left, done
            }
            int solved = mark_solved(1); // mark nodes won by Odd after Even's best response
            if (solved != 0) {
                remaining -= solved;
                if (remaining <= 0) break;
                continue; // restart major loop
            }
        }
        if (trace) logger << "Improving Odd's strategy..." << std::endl;
        if (switch_sym_strategy(1) == 0) {
            // Now all vertices not in a winning region are won by Even with strategy str1
            if (trace) logger << "No (possible) improvements - Even wins remainder." << std::endl;
            W0 |= G;
            for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
                str0[v] = str1[v];
            }
            break;
        }
        if (trace) logger << "Improving Even's strategy..." << std::endl;
        compute_vals_ll(0);
        if (switch_sym_strategy(0) == 0) {
            // Now all vertices not in a winning region are won by Odd with strategy str0
            if (trace) logger << "No (possible) improvements - Odd wins remainder." << std::endl;
            W1 |= G;
            for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
                str1[v] = str0[v];
            }
            break;
        }
    }

    for (auto v = W0.find_first(); v != bitset::npos; v = W0.find_next(v)) {
        Solver::solve(v, 0, owner(v) == 0 ? str0[v] : -1);
    }

    for (auto v = W1.find_first(); v != bitset::npos; v = W1.find_next(v)) {
        Solver::solve(v, 1, owner(v) == 1 ? str1[v] : -1);
    }

    delete[] val;
    delete[] first_in;
    delete[] next_in;
    delete[] str0;
    delete[] str1;

    logger << "solved with " << major << " major iterations, " << minor << " minor iterations." << std::endl;
}